

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Table * __thiscall
toml::Value::
ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
::to(ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
     *this,Value *v)

{
  char *local_10;
  char *local_8;
  
  if (v->type_ == TABLE_TYPE) {
    return (Table *)(v->field_1).null_;
  }
  local_8 = typeToString(v->type_);
  local_10 = "table";
  failwith<char_const(&)[27],char_const*,char_const(&)[6],char_const*,char_const(&)[15]>
            ((char (*) [27])"type error: this value is ",&local_8,(char (*) [6])" but ",&local_10,
             (char (*) [15])" was requested");
}

Assistant:

Type type() const { return type_; }